

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O2

void __thiscall KDReports::Test::testFirstLast(Test *this)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *t1;
  int iVar5;
  bool bVar6;
  Report report;
  long local_28;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  pvVar2 = (void *)KDReports::Report::header(&report,1);
  if (*(long *)(local_28 + 0x78) == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = *(long *)(*(long *)(local_28 + 0x78) + 0x30) != 0;
  }
  cVar1 = QTest::qVerify(bVar6,"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x40);
  if (cVar1 != '\0') {
    iVar5 = (int)local_28 + 0x78;
    pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar5,1);
    bVar6 = QTest::compare_ptr_helper
                      (pvVar3,pvVar2,"headers.headerForPage(1, 1)","&firstHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x41);
    if (bVar6) {
      pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar5,1);
      bVar6 = QTest::compare_ptr_helper
                        (pvVar3,pvVar2,"headers.headerForPage(1, 2)","&firstHeader",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x42);
      if (bVar6) {
        pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar5,2);
        bVar6 = QTest::compare_ptr_helper
                          (pvVar3,(void *)0x0,"headers.headerForPage(2, 2)","( Header * )nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                           ,0x43);
        if (bVar6) {
          pvVar3 = (void *)KDReports::Report::header(&report,8);
          pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar5,1);
          bVar6 = QTest::compare_ptr_helper
                            (pvVar4,pvVar2,"headers.headerForPage(1, 1)","&firstHeader",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                             ,0x45);
          if (bVar6) {
            pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar5,1);
            bVar6 = QTest::compare_ptr_helper
                              (pvVar4,pvVar2,"headers.headerForPage(1, 2)","&firstHeader",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                               ,0x46);
            if (bVar6) {
              pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar5,2);
              bVar6 = QTest::compare_ptr_helper
                                (pvVar4,pvVar3,"headers.headerForPage(2, 2)","&lastHeader",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                 ,0x47);
              if (bVar6) {
                pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar5,2);
                bVar6 = QTest::compare_ptr_helper
                                  (pvVar4,(void *)0x0,"headers.headerForPage(2, 3)",
                                   "( Header * )nullptr",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                   ,0x48);
                if (bVar6) {
                  pvVar4 = (void *)KDReports::Report::header(&report,6);
                  t1 = (void *)KDReports::HeaderMap::headerForPage(iVar5,1);
                  bVar6 = QTest::compare_ptr_helper
                                    (t1,pvVar2,"headers.headerForPage(1, 1)","&firstHeader",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                     ,0x4a);
                  if (bVar6) {
                    pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar5,2);
                    bVar6 = QTest::compare_ptr_helper
                                      (pvVar2,pvVar3,"headers.headerForPage(2, 2)","&lastHeader",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                       ,0x4b);
                    if (bVar6) {
                      pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar5,3);
                      bVar6 = QTest::compare_ptr_helper
                                        (pvVar2,pvVar3,"headers.headerForPage(3, 3)","&lastHeader",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                         ,0x4c);
                      if (bVar6) {
                        pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar5,2);
                        QTest::compare_ptr_helper
                                  (pvVar2,pvVar4,"headers.headerForPage(2, 3)","&normalHeader",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                   ,0x4d);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testFirstLast()
    {
        Report report;
        Header &firstHeader = report.header(FirstPage);
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader);
        QCOMPARE(headers.headerForPage(1, 2), &firstHeader);
        QCOMPARE(headers.headerForPage(2, 2), ( Header * )nullptr);
        Header &lastHeader = report.header(LastPage);
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader); // only one page -> use first header
        QCOMPARE(headers.headerForPage(1, 2), &firstHeader); // unchanged
        QCOMPARE(headers.headerForPage(2, 2), &lastHeader);
        QCOMPARE(headers.headerForPage(2, 3), ( Header * )nullptr);
        Header &normalHeader = report.header(AllPages);
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader); // unchanged
        QCOMPARE(headers.headerForPage(2, 2), &lastHeader); // unchanged
        QCOMPARE(headers.headerForPage(3, 3), &lastHeader);
        QCOMPARE(headers.headerForPage(2, 3), &normalHeader);
    }